

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prototype_factory.cpp
# Opt level: O3

int main(void)

{
  ostream *poVar1;
  Contact *local_60;
  Contact *local_58;
  string local_50;
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"John Doe","");
  EmployeeFactory::make_main_office_employee((EmployeeFactory *)&local_58,&local_30,100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  poVar1 = operator<<((ostream *)&std::cout,local_58);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Jane Doe","");
  EmployeeFactory::make_aux_office_employee((EmployeeFactory *)&local_60,&local_50,0x65);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  poVar1 = operator<<((ostream *)&std::cout,local_60);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_60 != (Contact *)0x0) {
    std::default_delete<Contact>::operator()((default_delete<Contact> *)&local_60,local_60);
  }
  if (local_58 != (Contact *)0x0) {
    std::default_delete<Contact>::operator()((default_delete<Contact> *)&local_58,local_58);
  }
  return 0;
}

Assistant:

int main()
{
	// Customize John
	auto john{EmployeeFactory::make_main_office_employee("John Doe", 100)};
	std::cout << *john << std::endl;

	// Customize Jane
	auto jane{EmployeeFactory::make_aux_office_employee("Jane Doe", 101)};
	std::cout << *jane << std::endl;

	return 0;
}